

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O3

void aom_int_pro_row_c(int16_t *hbuf,uint8_t *ref,int ref_stride,int width,int height,
                      int norm_factor)

{
  short sVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  
  if (0 < width) {
    uVar4 = 0;
    do {
      hbuf[uVar4] = 0;
      iVar2 = 0;
      if (0 < height) {
        sVar1 = 0;
        uVar3 = (ulong)(uint)height;
        pbVar5 = ref;
        do {
          sVar1 = sVar1 + (ushort)*pbVar5;
          hbuf[uVar4] = sVar1;
          pbVar5 = pbVar5 + ref_stride;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
        iVar2 = (int)sVar1;
      }
      hbuf[uVar4] = (int16_t)(iVar2 >> ((byte)norm_factor & 0x1f));
      ref = ref + 1;
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)width);
  }
  return;
}

Assistant:

void aom_int_pro_row_c(int16_t *hbuf, const uint8_t *ref, const int ref_stride,
                       const int width, const int height, int norm_factor) {
  assert(height >= 2);
  for (int idx = 0; idx < width; ++idx) {
    hbuf[idx] = 0;
    // hbuf[idx]: 14 bit, dynamic range [0, 32640].
    for (int i = 0; i < height; ++i) hbuf[idx] += ref[i * ref_stride];
    // hbuf[idx]: 9 bit, dynamic range [0, 1020].
    hbuf[idx] >>= norm_factor;
    ++ref;
  }
}